

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void llbuild::buildsystem::BuildSystemInvocation::getUsage(int optionWidth,raw_ostream *os)

{
  raw_ostream *prVar1;
  char **in_R8;
  string local_340;
  undefined8 local_320;
  format_object<int,_const_char_*> local_318;
  Options *local_2f8;
  Options *entry;
  Options *__end1;
  Options *__begin1;
  Options (*__range1) [11];
  Options options [11];
  raw_ostream *os_local;
  char *pcStack_168;
  int optionWidth_local;
  Options (**local_160) [11];
  char *local_158;
  size_t *local_150;
  char *local_148;
  size_t *local_140;
  char *local_138;
  size_t *local_130;
  char *local_128;
  size_t *local_120;
  char *local_118;
  size_t *local_110;
  char *local_108;
  size_t *local_100;
  char *local_f8;
  size_t *local_f0;
  char *local_e8;
  size_t *local_e0;
  char *local_d8;
  size_t *local_d0;
  char *local_c8;
  size_t *local_c0;
  char *local_b8;
  size_t *local_b0;
  char *local_a8;
  size_t *local_a0;
  char *local_98;
  size_t *local_90;
  char *local_88;
  size_t *local_80;
  char *local_78;
  size_t *local_70;
  char *local_68;
  size_t *local_60;
  char *local_58;
  size_t *local_50;
  char *local_48;
  size_t *local_40;
  char *local_38;
  size_t *local_30;
  char *local_28;
  size_t *local_20;
  char *local_18;
  size_t *local_10;
  
  local_160 = &__range1;
  pcStack_168 = "--help";
  __range1 = (Options (*) [11])anon_var_dwarf_36329;
  options[10].helpText.Length = (size_t)os;
  os_local._4_4_ = optionWidth;
  options[0].option.Data = (char *)strlen("--help");
  local_150 = &options[0].option.Length;
  local_158 = "show this help message and exit";
  options[0].option.Length = (size_t)anon_var_dwarf_2b66d1;
  options[0].helpText.Data = (char *)strlen("show this help message and exit");
  local_140 = &options[0].helpText.Length;
  local_148 = "--version";
  options[0].helpText.Length = (long)" --version" + 1;
  options[1].option.Data = (char *)strlen("--version");
  local_130 = &options[1].option.Length;
  local_138 = "show the tool version";
  options[1].option.Length = (size_t)anon_var_dwarf_2b66fd;
  options[1].helpText.Data = (char *)strlen("show the tool version");
  local_120 = &options[1].helpText.Length;
  local_128 = "-C <PATH>, --chdir <PATH>";
  options[1].helpText.Length = (size_t)anon_var_dwarf_2b6713;
  options[2].option.Data = (char *)strlen("-C <PATH>, --chdir <PATH>");
  local_110 = &options[2].option.Length;
  local_118 = "change directory to PATH before building";
  options[2].option.Length = (size_t)anon_var_dwarf_2b6729;
  options[2].helpText.Data = (char *)strlen("change directory to PATH before building");
  local_100 = &options[2].helpText.Length;
  local_108 = "--no-db";
  options[2].helpText.Length = (size_t)anon_var_dwarf_2b673f;
  options[3].option.Data = (char *)strlen("--no-db");
  local_f0 = &options[3].option.Length;
  local_f8 = "disable use of a build database";
  options[3].option.Length = (size_t)anon_var_dwarf_2b6749;
  options[3].helpText.Data = (char *)strlen("disable use of a build database");
  local_e0 = &options[3].helpText.Length;
  local_e8 = "--db <PATH>";
  options[3].helpText.Length = (size_t)anon_var_dwarf_2b6753;
  options[4].option.Data = (char *)strlen("--db <PATH>");
  local_d0 = &options[4].option.Length;
  local_d8 = "enable building against the database at PATH";
  options[4].option.Length = (size_t)anon_var_dwarf_2b6769;
  options[4].helpText.Data = (char *)strlen("enable building against the database at PATH");
  local_c0 = &options[4].helpText.Length;
  local_c8 = "-f <PATH>";
  options[4].helpText.Length = (size_t)anon_var_dwarf_2b677f;
  options[5].option.Data = (char *)strlen("-f <PATH>");
  local_b0 = &options[5].option.Length;
  local_b8 = "load the build task file at PATH";
  options[5].option.Length = (size_t)anon_var_dwarf_2b6789;
  options[5].helpText.Data = (char *)strlen("load the build task file at PATH");
  local_a0 = &options[5].helpText.Length;
  local_a8 = "--serial";
  options[5].helpText.Length = (size_t)anon_var_dwarf_2b679f;
  options[6].option.Data = (char *)strlen("--serial");
  local_90 = &options[6].option.Length;
  local_98 = "do not build in parallel";
  options[6].option.Length = (size_t)anon_var_dwarf_2b67b5;
  options[6].helpText.Data = (char *)strlen("do not build in parallel");
  local_80 = &options[6].helpText.Length;
  local_88 = "--scheduler <SCHEDULER>";
  options[6].helpText.Length = (size_t)anon_var_dwarf_2b67cb;
  options[7].option.Data = (char *)strlen("--scheduler <SCHEDULER>");
  local_70 = &options[7].option.Length;
  local_78 = "set scheduler algorithm";
  options[7].option.Length = (size_t)anon_var_dwarf_2b67e1;
  options[7].helpText.Data = (char *)strlen("set scheduler algorithm");
  local_60 = &options[7].helpText.Length;
  local_68 = "-j,--jobs <JOBS>";
  options[7].helpText.Length = (size_t)anon_var_dwarf_2b67eb;
  options[8].option.Data = (char *)strlen("-j,--jobs <JOBS>");
  local_50 = &options[8].option.Length;
  local_58 = "set how many concurrent jobs (lanes) to run";
  options[8].option.Length = (size_t)anon_var_dwarf_2b6801;
  options[8].helpText.Data = (char *)strlen("set how many concurrent jobs (lanes) to run");
  local_40 = &options[8].helpText.Length;
  local_48 = "-v, --verbose";
  options[8].helpText.Length = (size_t)anon_var_dwarf_2b6817;
  options[9].option.Data = (char *)strlen("-v, --verbose");
  local_30 = &options[9].option.Length;
  local_38 = "show verbose status information";
  options[9].option.Length = (size_t)anon_var_dwarf_2b682d;
  options[9].helpText.Data = (char *)strlen("show verbose status information");
  local_20 = &options[9].helpText.Length;
  local_28 = "--trace <PATH>";
  options[9].helpText.Length = (size_t)anon_var_dwarf_2b6837;
  options[10].option.Data = (char *)strlen("--trace <PATH>");
  local_10 = &options[10].option.Length;
  local_18 = "trace build engine operation to PATH";
  options[10].option.Length = (size_t)anon_var_dwarf_2b684d;
  options[10].helpText.Data = (char *)strlen("trace build engine operation to PATH");
  entry = (Options *)&options[10].helpText.Length;
  __end1 = (Options *)&__range1;
  __begin1 = __end1;
  for (; __end1 != entry; __end1 = __end1 + 1) {
    local_2f8 = __end1;
    prVar1 = llvm::raw_ostream::operator<<((raw_ostream *)options[10].helpText.Length,"  ");
    llvm::StringRef::str_abi_cxx11_(&local_340,&local_2f8->option);
    local_320 = std::__cxx11::string::c_str();
    llvm::format<int,char_const*>
              (&local_318,(llvm *)0x35a4d3,(char *)((long)&os_local + 4),(int *)&local_320,in_R8);
    prVar1 = llvm::raw_ostream::operator<<(prVar1,&local_318.super_format_object_base);
    prVar1 = llvm::raw_ostream::operator<<(prVar1," ");
    prVar1 = llvm::raw_ostream::operator<<(prVar1,local_2f8->helpText);
    llvm::raw_ostream::operator<<(prVar1,"\n");
    std::__cxx11::string::~string((string *)&local_340);
  }
  return;
}

Assistant:

void BuildSystemInvocation::getUsage(int optionWidth, raw_ostream& os) {
  const struct Options {
    llvm::StringRef option, helpText;
  } options[] = {
    { "--help", "show this help message and exit" },
    { "--version", "show the tool version" },
    { "-C <PATH>, --chdir <PATH>", "change directory to PATH before building" },
    { "--no-db", "disable use of a build database" },
    { "--db <PATH>", "enable building against the database at PATH" },
    { "-f <PATH>", "load the build task file at PATH" },
    { "--serial", "do not build in parallel" },
    { "--scheduler <SCHEDULER>", "set scheduler algorithm" },
    { "-j,--jobs <JOBS>", "set how many concurrent jobs (lanes) to run" },
    { "-v, --verbose", "show verbose status information" },
    { "--trace <PATH>", "trace build engine operation to PATH" },
  };
  
  for (const auto& entry: options) {
    os << "  " << llvm::format("%-*s", optionWidth, entry.option.str().c_str()) << " "
       << entry.helpText << "\n";
  }
}